

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ext_ri_parse_clienthello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  undefined1 *puVar1;
  SSL *ssl;
  uint16_t uVar2;
  int iVar3;
  bool bVar4;
  CBS renegotiated_connection;
  
  ssl = hs->ssl;
  if ((ssl->s3->field_0xdc & 0x10) == 0) {
    uVar2 = ssl_protocol_version(ssl);
    bVar4 = true;
    if ((contents != (CBS *)0x0) && (uVar2 < 0x304)) {
      iVar3 = CBS_get_u8_length_prefixed(contents,&renegotiated_connection);
      if ((iVar3 == 0) || (contents->len != 0)) {
        bVar4 = false;
        ERR_put_error(0x10,0,0xc9,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x31c);
      }
      else if (renegotiated_connection.len == 0) {
        puVar1 = &ssl->s3->field_0xdc;
        *(ushort *)puVar1 = *(ushort *)puVar1 | 0x40;
        bVar4 = true;
      }
      else {
        bVar4 = false;
        ERR_put_error(0x10,0,0xca,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x323);
        *out_alert = '(';
      }
    }
    return bVar4;
  }
  __assert_fail("!ssl->s3->initial_handshake_complete",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                ,0x30f,"bool bssl::ext_ri_parse_clienthello(SSL_HANDSHAKE *, uint8_t *, CBS *)");
}

Assistant:

static bool ext_ri_parse_clienthello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                     CBS *contents) {
  SSL *const ssl = hs->ssl;
  // Renegotiation isn't supported as a server so this function should never be
  // called after the initial handshake.
  assert(!ssl->s3->initial_handshake_complete);

  if (ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
    return true;
  }

  if (contents == NULL) {
    return true;
  }

  CBS renegotiated_connection;
  if (!CBS_get_u8_length_prefixed(contents, &renegotiated_connection) ||
      CBS_len(contents) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_RENEGOTIATION_ENCODING_ERR);
    return false;
  }

  // Check that the extension matches. We do not support renegotiation as a
  // server, so this must be empty.
  if (CBS_len(&renegotiated_connection) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_RENEGOTIATION_MISMATCH);
    *out_alert = SSL_AD_HANDSHAKE_FAILURE;
    return false;
  }

  ssl->s3->send_connection_binding = true;

  return true;
}